

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

string * __thiscall
flow::PhiNode::to_string_abi_cxx11_(string *__return_storage_ptr__,PhiNode *this)

{
  allocator<char> local_39;
  string local_38;
  PhiNode *local_18;
  PhiNode *this_local;
  
  local_18 = this;
  this_local = (PhiNode *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"phi",&local_39);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string PhiNode::to_string() const {
  return formatOne("phi");
}